

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.hpp
# Opt level: O3

void __thiscall antlr::ASTRefCount<antlr::BaseAST>::~ASTRefCount(ASTRefCount<antlr::BaseAST> *this)

{
  uint *puVar1;
  ASTRef *this_00;
  
  this_00 = this->ref;
  if (this_00 != (ASTRef *)0x0) {
    puVar1 = &this_00->count;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      ASTRef::~ASTRef(this_00);
      operator_delete(this_00,0x10);
      return;
    }
  }
  return;
}

Assistant:

~ASTRefCount()
	{
		if (ref && ref->decrement())
			delete ref;
	}